

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithNewPo(Gia_Man_t *p1,Gia_Man_t *p2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Gia_Man_t *p;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  
  if (p2->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x91e,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p2->vCis->nSize != p1->nRegs) {
    __assert_fail("Gia_ManPiNum(p2) == Gia_ManRegNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x922,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  p = Gia_ManStart(p2->nObjs + p1->nObjs);
  pcVar3 = p1->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p->pName = pcVar8;
  pcVar3 = p1->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p->pSpec = pcVar8;
  Gia_ManHashAlloc(p);
  p1->pObjs->Value = 0;
  pVVar10 = p1->vCis;
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar18];
      if (((long)iVar6 < 0) || (p1->nObjs <= iVar6)) goto LAB_001e3920;
      pGVar4 = p1->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p);
      uVar13 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p->nObjs <= pGVar9)) {
LAB_001e397d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p->nObjs <= pGVar9)) goto LAB_001e397d;
      pGVar4[iVar6].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar10 = p1->vCis;
    } while (lVar18 < pVVar10->nSize);
  }
  iVar6 = p1->nObjs;
  if (0 < iVar6) {
    lVar18 = 8;
    lVar19 = 0;
    do {
      pGVar4 = p1->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar4 + lVar18 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar14 = *(uint *)((long)pGVar4 +
                          lVar18 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar14 < 0) ||
           (uVar16 = *(uint *)((long)pGVar4 +
                              lVar18 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar16 < 0)) goto LAB_001e395e;
        iVar6 = Gia_ManHashAnd(p,uVar14 ^ (uint)(uVar13 >> 0x1d) & 1,
                               uVar16 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar18) = iVar6;
        iVar6 = p1->nObjs;
      }
      lVar19 = lVar19 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar19 < iVar6);
  }
  pGVar4 = p2->pObjs;
  pGVar4->Value = 0;
  iVar15 = p2->nRegs;
  pVVar10 = p2->vCis;
  uVar14 = pVVar10->nSize;
  if (uVar14 - iVar15 == 0 || (int)uVar14 < iVar15) {
    iVar12 = p2->nObjs;
    if (iVar12 < 1) goto LAB_001e37c9;
  }
  else {
    uVar17 = 0;
    uVar13 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar13 = uVar17;
    }
    do {
      if (uVar13 == uVar17) goto LAB_001e393f;
      iVar1 = pVVar10->pArray[uVar17];
      if (((long)iVar1 < 0) || (iVar12 = p2->nObjs, iVar12 <= iVar1)) goto LAB_001e3920;
      if ((long)p1->nRegs <= (long)uVar17) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
      }
      iVar2 = p1->vCis->nSize;
      uVar21 = (uint)(iVar2 - p1->nRegs) + uVar17;
      iVar20 = (int)uVar21;
      if ((iVar20 < 0) || (iVar2 <= iVar20)) goto LAB_001e393f;
      iVar2 = p1->vCis->pArray[uVar21 & 0xffffffff];
      if (((long)iVar2 < 0) || (iVar6 <= iVar2)) goto LAB_001e3920;
      pGVar4[iVar1].Value = p1->pObjs[iVar2].Value;
      uVar17 = uVar17 + 1;
    } while (uVar14 - iVar15 != uVar17);
  }
  lVar18 = 8;
  lVar19 = 0;
  do {
    pGVar4 = p2->pObjs;
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar13 = *(ulong *)((long)pGVar4 + lVar18 + -8);
    if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
      uVar14 = *(uint *)((long)pGVar4 + lVar18 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3
                        );
      if (((int)uVar14 < 0) ||
         (uVar16 = *(uint *)((long)pGVar4 +
                            lVar18 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
         (int)uVar16 < 0)) goto LAB_001e395e;
      iVar6 = Gia_ManHashAnd(p,uVar14 ^ (uint)(uVar13 >> 0x1d) & 1,
                             uVar16 ^ (uint)(uVar13 >> 0x3d) & 1);
      *(int *)(&pGVar4->field_0x0 + lVar18) = iVar6;
      iVar12 = p2->nObjs;
    }
    lVar19 = lVar19 + 1;
    lVar18 = lVar18 + 0xc;
  } while (lVar19 < iVar12);
  iVar15 = p2->nRegs;
LAB_001e37c9:
  pVVar10 = p2->vCos;
  uVar13 = (ulong)(uint)pVVar10->nSize;
  if (iVar15 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      if ((int)uVar13 <= lVar18) goto LAB_001e393f;
      iVar6 = pVVar10->pArray[lVar18];
      if (((long)iVar6 < 0) || (p2->nObjs <= iVar6)) goto LAB_001e3920;
      if (p2->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p2->pObjs + iVar6;
      uVar16 = (uint)*(undefined8 *)pGVar4;
      uVar14 = pGVar4[-(ulong)(uVar16 & 0x1fffffff)].Value;
      if ((int)uVar14 < 0) goto LAB_001e395e;
      Gia_ManAppendCo(p,uVar16 >> 0x1d & 1 ^ uVar14);
      lVar18 = lVar18 + 1;
      pVVar10 = p2->vCos;
      uVar13 = (ulong)pVVar10->nSize;
    } while (lVar18 < (long)(uVar13 - (long)p2->nRegs));
  }
  iVar6 = p1->nRegs;
  if (0 < iVar6) {
    iVar15 = 0;
    do {
      iVar12 = p1->vCos->nSize;
      uVar14 = (iVar12 - iVar6) + iVar15;
      if (((int)uVar14 < 0) || (iVar12 <= (int)uVar14)) {
LAB_001e393f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = p1->vCos->pArray[uVar14];
      if (((long)iVar6 < 0) || (p1->nObjs <= iVar6)) {
LAB_001e3920:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p1->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p1->pObjs + iVar6;
      uVar16 = (uint)*(undefined8 *)pGVar4;
      uVar14 = pGVar4[-(ulong)(uVar16 & 0x1fffffff)].Value;
      if ((int)uVar14 < 0) {
LAB_001e395e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p,uVar16 >> 0x1d & 1 ^ uVar14);
      iVar15 = iVar15 + 1;
      iVar6 = p1->nRegs;
    } while (iVar15 < iVar6);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,p1->nRegs);
  pGVar11 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManDupWithNewPo( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    // there is no flops in p2
    assert( Gia_ManRegNum(p2) == 0 );
    // there is only one PO in p2
//    assert( Gia_ManPoNum(p2) == 1 );
    // input count of p2 is equal to flop count of p1 
    assert( Gia_ManPiNum(p2) == Gia_ManRegNum(p1) );

    // start new AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p1)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p1->pName );
    pNew->pSpec = Abc_UtilStrsav( p1->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p1)->Value = 0;
    Gia_ManForEachCi( p1, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p1, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachPi( p2, pObj, i )
        pObj->Value = Gia_ManRo(p1, i)->Value;
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // add property output
    Gia_ManForEachPo( p2, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // add flop inputs
    Gia_ManForEachRi( p1, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p1) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}